

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

void Abc_NtkRetimeInsertLatchValues(Abc_Ntk_t *pNtk,Vec_Int_t *vValues)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = 0;
  for (iVar5 = 0; iVar1 = pNtk->vObjs->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8)) {
      aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar6;
      iVar6 = iVar6 + 1;
      pAVar2->field_6 = aVar4;
    }
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8)) {
      aVar3 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
      if (vValues != (Vec_Int_t *)0x0) {
        iVar6 = Vec_IntEntry(vValues,(pAVar2->field_6).iTemp);
        aVar3.pData = (void *)(2 - (ulong)(iVar6 == 0));
      }
      pAVar2->field_5 = aVar3;
    }
    iVar1 = pNtk->vObjs->nSize;
  }
  return;
}

Assistant:

void Abc_NtkRetimeInsertLatchValues( Abc_Ntk_t * pNtk, Vec_Int_t * vValues )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Counter++;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pData = (Abc_Obj_t *)(ABC_PTRUINT_T)(vValues? (Vec_IntEntry(vValues,(int)(ABC_PTRUINT_T)pObj->pCopy)? ABC_INIT_ONE : ABC_INIT_ZERO) : ABC_INIT_DC);
}